

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

Ssw_Cla_t * Ssw_ClassesStart(Aig_Man_t *pAig)

{
  int nIdMax;
  Ssw_Cla_t *pSVar1;
  Aig_Obj_t ***pppAVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  
  pSVar1 = (Ssw_Cla_t *)calloc(1,0x70);
  pSVar1->pAig = pAig;
  nIdMax = pAig->vObjs->nSize;
  pppAVar2 = (Aig_Obj_t ***)calloc((long)nIdMax,8);
  pSVar1->pId2Class = pppAVar2;
  piVar3 = (int *)calloc((long)nIdMax,4);
  pSVar1->pClassSizes = piVar3;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pSVar1->vClassOld = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pSVar1->vClassNew = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  pVVar4->pArray = ppvVar5;
  pSVar1->vRefined = pVVar4;
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    Aig_ManReprStart(pAig,nIdMax);
  }
  return pSVar1;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesStart( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    p = ABC_ALLOC( Ssw_Cla_t, 1 );
    memset( p, 0, sizeof(Ssw_Cla_t) );
    p->pAig         = pAig;
    p->pId2Class    = ABC_CALLOC( Aig_Obj_t **, Aig_ManObjNumMax(pAig) );
    p->pClassSizes  = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    p->vRefined     = Vec_PtrAlloc( 1000 );
    if ( pAig->pReprs == NULL )
        Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    return p;
}